

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPInternalSourceData::ProcessRTPPacket
          (RTPInternalSourceData *this,RTPPacket *rtppack,RTPTime *receivetime,bool *stored,
          RTPSources *sources)

{
  double *pdVar1;
  RTPPacket *obj;
  bool bVar2;
  size_type sVar3;
  reference ppRVar4;
  RTPMemoryManager *mgr;
  const_iterator local_a0;
  uint32_t local_94;
  RTPPacket *pRStack_90;
  uint32_t seqnr;
  RTPPacket *p_1;
  _List_node_base *local_80;
  uint32_t local_78;
  byte local_71;
  uint32_t newseqnr;
  bool done;
  iterator start;
  iterator it;
  RTPPacket *p;
  bool ispackethandled;
  double dStack_48;
  bool isonprobation;
  double tsunit;
  bool applyprobation;
  bool onprobation;
  RTPSources *pRStack_38;
  bool accept;
  RTPSources *sources_local;
  bool *stored_local;
  RTPTime *receivetime_local;
  RTPPacket *rtppack_local;
  RTPInternalSourceData *this_local;
  
  *stored = false;
  pdVar1 = &(this->super_RTPSourceData).timestampunit;
  pRStack_38 = sources;
  sources_local = (RTPSources *)stored;
  stored_local = (bool *)receivetime;
  receivetime_local = (RTPTime *)rtppack;
  rtppack_local = (RTPPacket *)this;
  if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
    dStack_48 = (this->super_RTPSourceData).timestampunit;
  }
  else {
    dStack_48 = RTPSourceData::INF_GetEstimatedTimestampUnit(&this->super_RTPSourceData);
  }
  if (((this->super_RTPSourceData).validated & 1U) == 0) {
    tsunit._5_1_ = this->probationtype != NoProbation;
  }
  else {
    tsunit._5_1_ = false;
  }
  RTPSourceStats::ProcessPacket
            (&(this->super_RTPSourceData).stats,(RTPPacket *)receivetime_local,
             (RTPTime *)stored_local,dStack_48,(bool)((this->super_RTPSourceData).ownssrc & 1),
             (bool *)((long)&tsunit + 7),(bool)tsunit._5_1_,(bool *)((long)&tsunit + 6));
  if (this->probationtype < ProbationStore) {
    if ((tsunit._7_1_ & 1) == 0) {
      return 0;
    }
    (this->super_RTPSourceData).validated = true;
  }
  else {
    if (this->probationtype != ProbationStore) {
      return -0x76;
    }
    if (((tsunit._6_1_ & 1) == 0) && ((tsunit._7_1_ & 1) == 0)) {
      return 0;
    }
    if ((tsunit._7_1_ & 1) != 0) {
      (this->super_RTPSourceData).validated = true;
    }
  }
  if ((((this->super_RTPSourceData).validated & 1U) != 0) &&
     (((this->super_RTPSourceData).ownssrc & 1U) == 0)) {
    (this->super_RTPSourceData).issender = true;
  }
  p._7_1_ = ((this->super_RTPSourceData).validated ^ 0xffU) & 1;
  p._6_1_ = 0;
  (*(pRStack_38->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x13])
            (pRStack_38,this,receivetime_local,(ulong)p._7_1_,(long)&p + 6);
  if ((p._6_1_ & 1) == 0) {
    bVar2 = std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::empty
                      (&(this->super_RTPSourceData).packetlist);
    if (bVar2) {
      *(undefined1 *)&(sources_local->super_RTPMemoryObject)._vptr_RTPMemoryObject = 1;
      std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::push_back
                (&(this->super_RTPSourceData).packetlist,(value_type *)&receivetime_local);
    }
    else {
      if ((((this->super_RTPSourceData).validated & 1U) == 0) &&
         (sVar3 = std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::
                  size(&(this->super_RTPSourceData).packetlist), sVar3 == 0x20)) {
        it = std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::begin
                       (&(this->super_RTPSourceData).packetlist);
        ppRVar4 = std::_List_iterator<jrtplib::RTPPacket_*>::operator*(&it);
        obj = *ppRVar4;
        std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::pop_front
                  (&(this->super_RTPSourceData).packetlist);
        mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        RTPDelete<jrtplib::RTPPacket>(obj,mgr);
      }
      std::_List_iterator<jrtplib::RTPPacket_*>::_List_iterator(&start);
      std::_List_iterator<jrtplib::RTPPacket_*>::_List_iterator
                ((_List_iterator<jrtplib::RTPPacket_*> *)&newseqnr);
      local_71 = 0;
      local_78 = RTPPacket::GetExtendedSequenceNumber((RTPPacket *)receivetime_local);
      local_80 = (_List_node_base *)
                 std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::
                 end(&(this->super_RTPSourceData).packetlist);
      start._M_node = local_80;
      std::_List_iterator<jrtplib::RTPPacket_*>::operator--(&start);
      p_1 = (RTPPacket *)
            std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::begin
                      (&(this->super_RTPSourceData).packetlist);
      _newseqnr = (iterator)p_1;
      while (((local_71 ^ 0xff) & 1) != 0) {
        ppRVar4 = std::_List_iterator<jrtplib::RTPPacket_*>::operator*(&start);
        pRStack_90 = *ppRVar4;
        local_94 = RTPPacket::GetExtendedSequenceNumber(pRStack_90);
        if (local_78 < local_94) {
          bVar2 = std::operator!=(&start,(_Self *)&newseqnr);
          if (bVar2) {
            std::_List_iterator<jrtplib::RTPPacket_*>::operator--(&start);
          }
          else {
            *(undefined1 *)&(sources_local->super_RTPMemoryObject)._vptr_RTPMemoryObject = 1;
            local_71 = 1;
            std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::
            push_front(&(this->super_RTPSourceData).packetlist,(value_type *)&receivetime_local);
          }
        }
        else {
          if (local_94 < local_78) {
            std::_List_iterator<jrtplib::RTPPacket_*>::operator++(&start);
            std::_List_const_iterator<jrtplib::RTPPacket_*>::_List_const_iterator(&local_a0,&start);
            std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::insert
                      (&(this->super_RTPSourceData).packetlist,local_a0,
                       (value_type *)&receivetime_local);
            *(undefined1 *)&(sources_local->super_RTPMemoryObject)._vptr_RTPMemoryObject = 1;
          }
          local_71 = 1;
        }
      }
    }
  }
  else {
    *(undefined1 *)&(sources_local->super_RTPMemoryObject)._vptr_RTPMemoryObject = 1;
  }
  return 0;
}

Assistant:

int RTPInternalSourceData::ProcessRTPPacket(RTPPacket *rtppack,const RTPTime &receivetime,bool *stored,RTPSources *sources)
{
	bool accept,onprobation,applyprobation;
	double tsunit;
	
	*stored = false;
	
	if (timestampunit < 0) 
		tsunit = INF_GetEstimatedTimestampUnit();
	else
		tsunit = timestampunit;

#ifdef RTP_SUPPORT_PROBATION
	if (validated) 				// If the source is our own process, we can already be validated. No 
		applyprobation = false;		// probation should be applied in that case.
	else
	{
		if (probationtype == RTPSources::NoProbation)
			applyprobation = false;
		else
			applyprobation = true;
	}
#else
	applyprobation = false;
#endif // RTP_SUPPORT_PROBATION

	stats.ProcessPacket(rtppack,receivetime,tsunit,ownssrc,&accept,applyprobation,&onprobation);

#ifdef RTP_SUPPORT_PROBATION
	switch (probationtype)
	{
		case RTPSources::ProbationStore:
			if (!(onprobation || accept))
				return 0;
			if (accept)
				validated = true;
			break;
		case RTPSources::ProbationDiscard:
		case RTPSources::NoProbation:
			if (!accept)
				return 0;
			validated = true;
			break;
		default:
			return ERR_RTP_INTERNALSOURCEDATA_INVALIDPROBATIONTYPE;
	}
#else
	if (!accept)
		return 0;
	validated = true;
#endif // RTP_SUPPORT_PROBATION;
	
	if (validated && !ownssrc) // for own ssrc these variables depend on the outgoing packets, not on the incoming
		issender = true;
	
	bool isonprobation = !validated;
	bool ispackethandled = false;

	sources->OnValidatedRTPPacket(this, rtppack, isonprobation, &ispackethandled);
	if (ispackethandled) // Packet is already handled in the callback, no need to store it in the list
	{
		// Set 'stored' to true to avoid the packet being deallocated
		*stored = true;
		return 0;
	}

	// Now, we can place the packet in the queue
	
	if (packetlist.empty())
	{
		*stored = true;
		packetlist.push_back(rtppack);
		return 0;
	}
	
	if (!validated) // still on probation
	{
		// Make sure that we don't buffer too much packets to avoid wasting memory
		// on a bad source. Delete the packet in the queue with the lowest sequence
		// number.
		if (packetlist.size() == RTPINTERNALSOURCEDATA_MAXPROBATIONPACKETS)
		{
			RTPPacket *p = *(packetlist.begin());
			packetlist.pop_front();
			RTPDelete(p,GetMemoryManager());
		}
	}

	// find the right position to insert the packet
	
	std::list<RTPPacket*>::iterator it,start;
	bool done = false;
	uint32_t newseqnr = rtppack->GetExtendedSequenceNumber();
	
	it = packetlist.end();
	--it;
	start = packetlist.begin();
	
	while (!done)
	{
		RTPPacket *p;
		uint32_t seqnr;
		
		p = *it;
		seqnr = p->GetExtendedSequenceNumber();
		if (seqnr > newseqnr)
		{
			if (it != start)
				--it;
			else // we're at the start of the list
			{
				*stored = true;
				done = true;
				packetlist.push_front(rtppack);
			}
		}
		else if (seqnr < newseqnr) // insert after this packet
		{
			++it;
			packetlist.insert(it,rtppack);
			done = true;
			*stored = true;
		}
		else // they're equal !! Drop packet
		{
			done = true;
		}
	}

	return 0;
}